

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_4.cpp
# Opt level: O0

string * get_line(string *__return_storage_ptr__,string *_prompt)

{
  ostream *poVar1;
  string *_prompt_local;
  string *line;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)_prompt);
  std::operator<<(poVar1,": ");
  std::ostream::flush();
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string get_line(string const& _prompt)
{
	cout << _prompt << ": ";
	cout.flush();

	string line;
	getline(cin, line);
	return line;
}